

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall tetgenmesh::splitsliver(tetgenmesh *this,triface *slitet,double cosd,int chkencflag)

{
  tetrahedron *pppdVar1;
  uint *puVar2;
  long lVar3;
  tetgenmesh *this_00;
  int iVar4;
  long *plVar5;
  tetrahedron *pppdVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  tetrahedron *pppdVar10;
  long lVar11;
  long *plVar12;
  bool bVar13;
  triface *parytet;
  triface local_130;
  int local_11c;
  long *local_118;
  tetgenmesh *local_110;
  optparameters opm;
  double smtpt [3];
  point steinerpt;
  insertvertexflags ivf;
  
  local_130.tet = (tetrahedron *)0x0;
  local_130.ver = 0;
  opm.max_min_volume = 0;
  opm.min_max_aspectratio = 0;
  opm.min_max_dihedangle = 0;
  opm.initval = 0.0;
  opm.imprval = 0.0;
  ivf.refinetet.ver = 0;
  opm.numofsearchdirs = 10;
  ivf.refinesh.shver = 0;
  ivf.refinetet.tet = (tetrahedron *)0x0;
  opm.searchstep = 0.01;
  ivf.refinesh.sh = (shellface *)0x0;
  ivf.smlenflag = 0;
  opm.maxiter = -1;
  opm.smthiter = 0;
  ivf.smlen = 0.0;
  ivf.iloc = 0;
  ivf.bowywat = 0;
  ivf.lawson = 0;
  ivf.splitbdflag = 0;
  ivf.refineflag = 0;
  ivf.validflag = 0;
  ivf.respectbdflag = 0;
  ivf.rejflag = 0;
  ivf.chkencflag = 0;
  ivf.cdtflag = 0;
  ivf.assignmeshsize = 0;
  ivf.sloc = 0;
  ivf.sbowywat = 0;
  pppdVar10 = slitet->tet;
  iVar4 = edestoppotbl[slitet->ver];
  if ((pppdVar10[8] == (tetrahedron)0x0) || (pppdVar10[8][ver2edge[iVar4]] == (double *)0x0)) {
    lVar11 = 0;
    lVar8 = 0;
    pppdVar6 = pppdVar10;
    iVar9 = iVar4;
    do {
      if (pppdVar6[7] == (tetrahedron)this->dummypoint) {
        return 0;
      }
      pppdVar1 = pppdVar6 + facepivot1[iVar9];
      pppdVar6 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
      iVar9 = facepivot2[iVar9][(uint)*pppdVar1 & 0xf];
      lVar8 = lVar8 + 1;
      lVar11 = lVar11 + -0x10;
    } while (pppdVar10 != pppdVar6);
    if (pppdVar6[7] != (tetrahedron)this->dummypoint) {
      local_11c = chkencflag;
      local_118 = (long *)operator_new__(-lVar11);
      plVar5 = local_118;
      do {
        *plVar5 = 0;
        *(undefined4 *)(plVar5 + 1) = 0;
        plVar5 = plVar5 + 2;
      } while ((long *)((long)local_118 - lVar11) != plVar5);
      plVar5 = local_118 + 1;
      lVar11 = lVar8;
      while (bVar13 = lVar11 != 0, lVar11 = lVar11 + -1, bVar13) {
        plVar5[-1] = (long)pppdVar10;
        *(int *)plVar5 = iVar4;
        pppdVar6 = pppdVar10 + facepivot1[iVar4];
        pppdVar10 = (tetrahedron *)((ulong)*pppdVar6 & 0xfffffffffffffff0);
        iVar4 = facepivot2[iVar4][(uint)*pppdVar6 & 0xf];
        plVar5 = plVar5 + 2;
      }
      plVar5 = local_118 + 1;
      lVar11 = lVar8;
      local_110 = this;
      while (this_00 = local_110, plVar12 = local_118, bVar13 = lVar11 != 0, lVar11 = lVar11 + -1,
            bVar13) {
        pppdVar10 = (tetrahedron *)plVar5[-1];
        iVar4 = esymtbl[eprevtbl[(int)*plVar5]];
        arraypool::newindex(this->cavetetlist,&parytet);
        parytet->tet = pppdVar10;
        parytet->ver = iVar4;
        pppdVar10 = (tetrahedron *)plVar5[-1];
        iVar4 = esymtbl[enexttbl[(int)*plVar5]];
        local_130.tet = pppdVar10;
        local_130.ver = iVar4;
        arraypool::newindex(this->cavetetlist,&parytet);
        parytet->tet = pppdVar10;
        parytet->ver = iVar4;
        plVar5 = plVar5 + 2;
      }
      lVar11 = *(long *)(*local_118 + (long)orgpivot[(int)local_118[1]] * 8);
      lVar3 = *(long *)(*local_118 + (long)destpivot[(int)local_118[1]] * 8);
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        smtpt[lVar7] = (*(double *)(lVar11 + lVar7 * 8) + *(double *)(lVar3 + lVar7 * 8)) * 0.5;
      }
      opm.min_max_dihedangle = 1;
      opm.initval = cosd + 1.0;
      opm.numofsearchdirs = 0x14;
      opm.searchstep = 0.001;
      opm.maxiter = 100;
      iVar4 = smoothpoint(local_110,smtpt,local_110->cavetetlist,1,&opm);
      if (iVar4 == 0) {
        this_00->cavetetlist->objects = 0;
        operator_delete__(plVar12);
      }
      else {
        while( true ) {
          if (opm.smthiter != opm.maxiter) break;
          opm.searchstep = opm.searchstep * 10.0;
          opm.initval = opm.imprval;
          opm._48_8_ = opm._48_8_ & 0xffffffff;
          smoothpoint(this_00,smtpt,this_00->cavetetlist,1,&opm);
        }
        this_00->cavetetlist->objects = 0;
        makepoint(this_00,&steinerpt,FREEVOLVERTEX);
        for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
          steinerpt[lVar11] = smtpt[lVar11];
        }
        while (plVar5 = local_118, bVar13 = lVar8 != 0, lVar8 = lVar8 + -1, bVar13) {
          puVar2 = (uint *)(*plVar12 + (long)this_00->elemmarkerindex * 4);
          *puVar2 = *puVar2 | 1;
          arraypool::newindex(this_00->caveoldtetlist,&parytet);
          parytet->tet = (tetrahedron *)*plVar12;
          parytet->ver = (int)plVar12[1];
          plVar12 = plVar12 + 2;
        }
        local_130.tet = (tetrahedron *)*local_118;
        local_130.ver = (int)local_118[1];
        if (this_00->b->metric != 0) {
          locate(this_00,steinerpt,&local_130,0);
        }
        operator_delete__(plVar5);
        ivf.iloc = 0xb;
        ivf.chkencflag = local_11c;
        ivf.assignmeshsize = this_00->b->metric;
        iVar4 = insertpoint(this_00,steinerpt,&local_130,(face *)0x0,(face *)0x0,&ivf);
        if (iVar4 != 0) {
          this_00->st_volref_count = this_00->st_volref_count + 1;
          if (this_00->steinerleft < 1) {
            return 1;
          }
          this_00->steinerleft = this_00->steinerleft + -1;
          return 1;
        }
        pointdealloc(this_00,steinerpt);
      }
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::splitsliver(triface *slitet, REAL cosd, int chkencflag)
{
  triface *abtets;
  triface searchtet, spintet, *parytet;
  point pa, pb, steinerpt;
  optparameters opm;
  insertvertexflags ivf;
  REAL smtpt[3], midpt[3];
  int success;
  int t1ver;
  int n, i;

  // 'slitet' is [c,d,a,b], where [c,d] has a big dihedral angle. 
  // Go to the opposite edge [a,b].
  edestoppo(*slitet, searchtet); // [a,b,c,d].

  // Do not split a segment.
  if (issubseg(searchtet)) {
    return 0; 
  }

  // Count the number of tets shared at [a,b].
  // Do not split it if it is a hull edge.
  spintet = searchtet;
  n = 0; 
  while (1) {
    if (ishulltet(spintet)) break;
    n++;
    fnextself(spintet);
    if (spintet.tet == searchtet.tet) break;
  }
  if (ishulltet(spintet)) {
    return 0; // It is a hull edge.
  }

  // Get all tets at edge [a,b].
  abtets = new triface[n];
  spintet = searchtet;
  for (i = 0; i < n; i++) {
    abtets[i] = spintet;
    fnextself(spintet);
  }

  // Initialize the list of 2n boundary faces.
  for (i = 0; i < n; i++) {    
    eprev(abtets[i], searchtet);
    esymself(searchtet); // [a,p_i,p_i+1].
    cavetetlist->newindex((void **) &parytet);
    *parytet = searchtet;
    enext(abtets[i], searchtet);
    esymself(searchtet); // [p_i,b,p_i+1].
    cavetetlist->newindex((void **) &parytet);
    *parytet = searchtet;
  }

  // Init the Steiner point at the midpoint of edge [a,b].
  pa = org(abtets[0]);
  pb = dest(abtets[0]);
  for (i = 0; i < 3; i++) {
    smtpt[i] = midpt[i] = 0.5 * (pa[i] + pb[i]);
  }

  // Point smooth options.
  opm.min_max_dihedangle = 1;
  opm.initval = cosd + 1.0; // Initial volume is zero.
  opm.numofsearchdirs = 20;
  opm.searchstep = 0.001;  
  opm.maxiter = 100; // Limit the maximum iterations.

  success = smoothpoint(smtpt, cavetetlist, 1, &opm);

  if (success) {
    while (opm.smthiter == opm.maxiter) {
      // It was relocated and the prescribed maximum iteration reached. 
      // Try to increase the search stepsize.
      opm.searchstep *= 10.0;
      //opm.maxiter = 100; // Limit the maximum iterations.
      opm.initval = opm.imprval;
      opm.smthiter = 0; // Init.
      smoothpoint(smtpt, cavetetlist, 1, &opm);  
    }
  } // if (success)

  cavetetlist->restart();

  if (!success) {
    delete [] abtets;
    return 0;
  }


  // Insert the Steiner point.
  makepoint(&steinerpt, FREEVOLVERTEX);
  for (i = 0; i < 3; i++) steinerpt[i] = smtpt[i];

  // Insert the created Steiner point.
  for (i = 0; i < n; i++) {
    infect(abtets[i]);
    caveoldtetlist->newindex((void **) &parytet);
    *parytet = abtets[i];
  }

  searchtet = abtets[0]; // No need point location.
  if (b->metric) {
    locate(steinerpt, &searchtet); // For size interpolation.
  }

  delete [] abtets;

  ivf.iloc = (int) INSTAR;
  ivf.chkencflag = chkencflag;
  ivf.assignmeshsize = b->metric; 


  if (insertpoint(steinerpt, &searchtet, NULL, NULL, &ivf)) {
    // The vertex has been inserted.
    st_volref_count++; 
    if (steinerleft > 0) steinerleft--;
    return 1;
  } else {
    // The Steiner point is too close to an existing vertex. Reject it.
    pointdealloc(steinerpt);
    return 0;
  }
}